

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O0

Node * __thiscall
icu_63::StringTrieBuilder::makeNode
          (StringTrieBuilder *this,int32_t start,int32_t limit,int32_t unitIndex,
          UErrorCode *errorCode)

{
  bool bVar1;
  UBool UVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Node *pNVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  BranchHeadNode *pBVar7;
  size_t size;
  BranchHeadNode *local_c8;
  BranchHeadNode *local_b8;
  Node *subNode;
  int32_t length_1;
  int32_t maxLinearMatchLength;
  int32_t length;
  Node *nextNode;
  int32_t lastUnitIndex;
  int32_t maxUnit;
  int32_t minUnit;
  Node *node;
  int32_t value;
  UBool hasValue;
  UErrorCode *errorCode_local;
  int32_t unitIndex_local;
  int32_t limit_local;
  int32_t start_local;
  StringTrieBuilder *this_local;
  
  UVar2 = ::U_FAILURE(*errorCode);
  if (UVar2 == '\0') {
    bVar1 = false;
    node._0_4_ = 0;
    iVar3 = (*(this->super_UObject)._vptr_UObject[3])(this,(ulong)(uint)start);
    unitIndex_local = start;
    if (unitIndex == iVar3) {
      unitIndex_local = start + 1;
      node._0_4_ = (*(this->super_UObject)._vptr_UObject[5])();
      if (unitIndex_local == limit) {
        pNVar6 = registerFinalValue(this,(int)node,errorCode);
        return pNVar6;
      }
      bVar1 = true;
    }
    uVar4 = (*(this->super_UObject)._vptr_UObject[4])
                      (this,(ulong)(uint)unitIndex_local,(ulong)(uint)unitIndex);
    uVar5 = (*(this->super_UObject)._vptr_UObject[4])
                      (this,(ulong)(limit - 1),(ulong)(uint)unitIndex);
    if ((uVar4 & 0xffff) == (uVar5 & 0xffff)) {
      nextNode._4_4_ =
           (*(this->super_UObject)._vptr_UObject[6])
                     (this,(ulong)(uint)unitIndex_local,(ulong)(limit - 1),(ulong)(uint)unitIndex);
      _maxLinearMatchLength = makeNode(this,unitIndex_local,limit,nextNode._4_4_,errorCode);
      length_1 = nextNode._4_4_ - unitIndex;
      uVar4 = (*(this->super_UObject)._vptr_UObject[0xd])();
      while ((int)uVar4 < length_1) {
        nextNode._4_4_ = nextNode._4_4_ - uVar4;
        length_1 = length_1 - uVar4;
        iVar3 = (*(this->super_UObject)._vptr_UObject[0xe])
                          (this,(ulong)(uint)unitIndex_local,(ulong)nextNode._4_4_,(ulong)uVar4,
                           _maxLinearMatchLength);
        _maxLinearMatchLength = registerNode(this,(Node *)CONCAT44(extraout_var,iVar3),errorCode);
      }
      size = (size_t)(uint)unitIndex_local;
      iVar3 = (*(this->super_UObject)._vptr_UObject[0xe])
                        (this,size,(ulong)(uint)unitIndex,(ulong)(uint)length_1,
                         _maxLinearMatchLength);
      _maxUnit = (BranchHeadNode *)CONCAT44(extraout_var_00,iVar3);
    }
    else {
      uVar4 = (*(this->super_UObject)._vptr_UObject[7])
                        (this,(ulong)(uint)unitIndex_local,(ulong)(uint)limit,(ulong)(uint)unitIndex
                        );
      size = (size_t)(uint)unitIndex_local;
      pNVar6 = makeBranchSubNode(this,unitIndex_local,limit,unitIndex,uVar4,errorCode);
      pBVar7 = (BranchHeadNode *)UMemory::operator_new((UMemory *)0x28,size);
      local_b8 = (BranchHeadNode *)0x0;
      if (pBVar7 != (BranchHeadNode *)0x0) {
        size = (size_t)uVar4;
        BranchHeadNode::BranchHeadNode(pBVar7,uVar4,pNVar6);
        local_b8 = pBVar7;
      }
      _maxUnit = local_b8;
    }
    if ((bVar1) && (_maxUnit != (BranchHeadNode *)0x0)) {
      iVar3 = (*(this->super_UObject)._vptr_UObject[10])();
      if ((char)iVar3 == '\0') {
        pBVar7 = (BranchHeadNode *)UMemory::operator_new((UMemory *)0x20,size);
        local_c8 = (BranchHeadNode *)0x0;
        if (pBVar7 != (BranchHeadNode *)0x0) {
          pNVar6 = registerNode(this,(Node *)_maxUnit,errorCode);
          IntermediateValueNode::IntermediateValueNode
                    ((IntermediateValueNode *)pBVar7,(int)node,pNVar6);
          local_c8 = pBVar7;
        }
        _maxUnit = local_c8;
      }
      else {
        ValueNode::setValue(&_maxUnit->super_ValueNode,(int)node);
      }
    }
    this_local = (StringTrieBuilder *)registerNode(this,(Node *)_maxUnit,errorCode);
  }
  else {
    this_local = (StringTrieBuilder *)0x0;
  }
  return (Node *)this_local;
}

Assistant:

StringTrieBuilder::Node *
StringTrieBuilder::makeNode(int32_t start, int32_t limit, int32_t unitIndex, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return NULL;
    }
    UBool hasValue=FALSE;
    int32_t value=0;
    if(unitIndex==getElementStringLength(start)) {
        // An intermediate or final value.
        value=getElementValue(start++);
        if(start==limit) {
            return registerFinalValue(value, errorCode);
        }
        hasValue=TRUE;
    }
    Node *node;
    // Now all [start..limit[ strings are longer than unitIndex.
    int32_t minUnit=getElementUnit(start, unitIndex);
    int32_t maxUnit=getElementUnit(limit-1, unitIndex);
    if(minUnit==maxUnit) {
        // Linear-match node: All strings have the same character at unitIndex.
        int32_t lastUnitIndex=getLimitOfLinearMatch(start, limit-1, unitIndex);
        Node *nextNode=makeNode(start, limit, lastUnitIndex, errorCode);
        // Break the linear-match sequence into chunks of at most kMaxLinearMatchLength.
        int32_t length=lastUnitIndex-unitIndex;
        int32_t maxLinearMatchLength=getMaxLinearMatchLength();
        while(length>maxLinearMatchLength) {
            lastUnitIndex-=maxLinearMatchLength;
            length-=maxLinearMatchLength;
            node=createLinearMatchNode(start, lastUnitIndex, maxLinearMatchLength, nextNode);
            nextNode=registerNode(node, errorCode);
        }
        node=createLinearMatchNode(start, unitIndex, length, nextNode);
    } else {
        // Branch node.
        int32_t length=countElementUnits(start, limit, unitIndex);
        // length>=2 because minUnit!=maxUnit.
        Node *subNode=makeBranchSubNode(start, limit, unitIndex, length, errorCode);
        node=new BranchHeadNode(length, subNode);
    }
    if(hasValue && node!=NULL) {
        if(matchNodesCanHaveValues()) {
            ((ValueNode *)node)->setValue(value);
        } else {
            node=new IntermediateValueNode(value, registerNode(node, errorCode));
        }
    }
    return registerNode(node, errorCode);
}